

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

string * __thiscall
cmUuid::ByteToHex_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar inputByte)

{
  byte bVar1;
  char *pcVar2;
  char local_51;
  int local_30;
  char c;
  uchar rest;
  int i;
  allocator<char> local_1b;
  undefined1 local_1a;
  byte local_19;
  cmUuid *pcStack_18;
  uchar inputByte_local;
  cmUuid *this_local;
  string *result;
  
  local_1a = 0;
  local_19 = inputByte;
  pcStack_18 = this;
  this_local = (cmUuid *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"  ",&local_1b);
  std::allocator<char>::~allocator(&local_1b);
  for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
    bVar1 = local_19 % 0x10;
    local_19 = local_19 / 0x10;
    if (bVar1 < 10) {
      local_51 = bVar1 + 0x30;
    }
    else {
      local_51 = bVar1 + 0x57;
    }
    pcVar2 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
    *pcVar2 = local_51;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::ByteToHex(unsigned char inputByte) const
{
  std::string result("  ");
  for (int i = 0; i < 2; ++i) {
    unsigned char rest = inputByte % 16;
    inputByte /= 16;
    char c = (rest < 0xA) ? static_cast<char>('0' + rest)
                          : static_cast<char>('a' + (rest - 0xA));
    result.at(1 - i) = c;
  }

  return result;
}